

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::CLUFactor<double>::vSolveRight4update2sparse
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int *rn,
          double eps2,double *vec2,int *idx2,double *rhs2,int *ridx2,int *rn2,double *forest,
          int *forestNum,int *forestIdx)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  vSolveLright2(this,rhs,ridx,rn,eps,rhs2,ridx2,rn2,eps2);
  piVar3 = (this->row).perm;
  iVar4 = *rn;
  if (forest == (double *)0x0) {
    if (iVar4 < 1) {
      uVar7 = 0;
    }
    else {
      lVar6 = 0;
      uVar7 = 0;
      do {
        iVar2 = ridx[lVar6];
        if (ABS(rhs[iVar2]) <= eps) {
          rhs[iVar2] = 0.0;
        }
        else {
          iVar4 = piVar3[iVar2];
          uVar9 = uVar7;
          if (0 < (int)uVar7) {
            do {
              uVar8 = uVar9 - 1;
              uVar5 = uVar8 >> 1;
              if (iVar4 <= ridx[uVar5]) break;
              ridx[uVar9] = ridx[uVar5];
              uVar9 = uVar5;
            } while (1 < uVar8);
          }
          uVar7 = uVar7 + 1;
          ridx[(int)uVar9] = iVar4;
          iVar4 = *rn;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar4);
    }
    *rn = uVar7;
  }
  else {
    if (iVar4 < 1) {
      uVar7 = 0;
    }
    else {
      lVar6 = 0;
      uVar7 = 0;
      do {
        iVar2 = ridx[lVar6];
        dVar1 = rhs[iVar2];
        if (ABS(dVar1) <= eps) {
          rhs[iVar2] = 0.0;
        }
        else {
          *forestIdx = iVar2;
          iVar4 = piVar3[iVar2];
          uVar9 = uVar7;
          if (0 < (int)uVar7) {
            do {
              uVar5 = uVar9 - 1;
              uVar8 = uVar5 >> 1;
              if (iVar4 <= ridx[uVar8]) break;
              ridx[uVar9] = ridx[uVar8];
              uVar9 = uVar8;
            } while (1 < uVar5);
          }
          forestIdx = forestIdx + 1;
          uVar7 = uVar7 + 1;
          ridx[(int)uVar9] = iVar4;
          forest[iVar2] = dVar1;
          iVar4 = *rn;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar4);
    }
    *rn = uVar7;
    *forestNum = uVar7;
  }
  iVar4 = *rn2;
  if (iVar4 < 1) {
    uVar7 = 0;
  }
  else {
    lVar6 = 0;
    uVar7 = 0;
    do {
      iVar2 = ridx2[lVar6];
      if (ABS(rhs2[iVar2]) <= eps2) {
        rhs2[iVar2] = 0.0;
      }
      else {
        iVar4 = piVar3[iVar2];
        uVar9 = uVar7;
        if (0 < (int)uVar7) {
          do {
            uVar8 = uVar9 - 1;
            uVar5 = uVar8 >> 1;
            if (iVar4 <= ridx2[uVar5]) break;
            ridx2[uVar9] = ridx2[uVar5];
            uVar9 = uVar5;
          } while (1 < uVar8);
        }
        uVar7 = uVar7 + 1;
        ridx2[(int)uVar9] = iVar4;
        iVar4 = *rn2;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
  }
  *rn2 = uVar7;
  iVar4 = vSolveUright(this,vec,idx,rhs,ridx,*rn,eps);
  *rn = iVar4;
  iVar4 = vSolveUright(this,vec2,idx2,rhs2,ridx2,*rn2,eps2);
  *rn2 = iVar4;
  if ((this->l).updateType == 0) {
    iVar4 = vSolveUpdateRight(this,vec,idx,*rn,eps);
    *rn = iVar4;
    iVar4 = vSolveUpdateRight(this,vec2,idx2,*rn2,eps2);
    *rn2 = iVar4;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update2sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R* forest, int* forestNum, int* forestIdx)
{
   /* solve with L */
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap for both ridx and ridx2 */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   /* solve with U */
   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
   }
}